

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CArena.cpp
# Opt level: O2

void __thiscall amrex::CArena::PrintUsage(CArena *this,ostream *os,string *name,string *space)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,(string *)space);
  poVar1 = std::operator<<(poVar1,"[");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"] space allocated (MB): ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(os,(string *)space);
  poVar1 = std::operator<<(poVar1,"[");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"] space used      (MB): ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(os,(string *)space);
  poVar1 = std::operator<<(poVar1,"[");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,"]: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," allocs, ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," busy blocks, ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," free blocks\n");
  return;
}

Assistant:

void
CArena::PrintUsage (std::ostream& os, std::string const& name, std::string const& space) const
{
    Long megabytes = heap_space_used() / (1024*1024);
    Long actual_megabytes = heap_space_actually_used() / (1024*1024);
    os << space << "[" << name << "] space allocated (MB): " << megabytes << "\n";
    os << space << "[" << name << "] space used      (MB): " << actual_megabytes << "\n";
    os << space << "[" << name << "]: " << m_alloc.size() << " allocs, "
       << m_busylist.size() << " busy blocks, " << m_freelist.size() << " free blocks\n";
}